

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

int callback_get(void *data)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = *(ulong *)((long)data + 0x408);
  if (*(ulong *)((long)data + 0x400) <= uVar3) {
    *(undefined8 *)((long)data + 0x408) = 0;
    lVar2 = (**(code **)((long)data + 0x410))(data,0x400,*(undefined8 *)((long)data + 0x418));
    *(long *)((long)data + 0x400) = lVar2;
    if (lVar2 + 1U < 2) {
      return -1;
    }
    uVar3 = *(ulong *)((long)data + 0x408);
  }
  bVar1 = *(byte *)((long)data + uVar3);
  *(ulong *)((long)data + 0x408) = uVar3 + 1;
  return (uint)bVar1;
}

Assistant:

static int callback_get(void *data)
{
	char c;
	callback_data_t *stream = data;

	if (stream->pos >= stream->len) {
		stream->pos = 0;
		stream->len = stream->callback(stream->data, MAX_BUF_LEN, stream->arg);
		if (stream->len == 0 || stream->len == (size_t)-1)
			return EOF;
	}

	c = stream->data[stream->pos];
	stream->pos++;
	return (unsigned char)c;
}